

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O1

ssize_t __thiscall
libtorrent::aux::posix_part_file::write(posix_part_file *this,int __fd,void *__buf,size_t __n)

{
  _Alloc_hider __s;
  void *pvVar1;
  slot_index_t sVar2;
  int iVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  void *pvVar6;
  int *piVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  int in_R8D;
  int *in_R9;
  file_pointer f;
  key_type local_44;
  _Alloc_hider local_40;
  void *local_38;
  
  local_44.m_val = (int)__n;
  open_file((posix_part_file *)&stack0xffffffffffffffc0,(open_mode)this,(error_code *)0x1);
  uVar8 = 0xffffffff;
  if ((char)in_R9[1] == '\0') {
    p_Var4 = ::std::
             _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_piece_map)._M_h,
                        (ulong)(long)local_44.m_val % (this->m_piece_map)._M_h._M_bucket_count,
                        &local_44,(long)local_44.m_val);
    if (p_Var4 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var4->_M_nxt;
    }
    local_38 = __buf;
    if (p_Var5 == (_Hash_node_base *)0x0) {
      sVar2 = allocate_slot(this,local_44.m_val);
    }
    else {
      sVar2.m_val = *(int *)((long)&p_Var5[1]._M_nxt + 4);
    }
    __s._M_p = local_40._M_p;
    iVar3 = fseeko64((FILE *)local_40._M_p,
                     (long)in_R8D + (long)this->m_header_size +
                     (long)this->m_piece_size * (long)sVar2.m_val,0);
    pvVar1 = local_38;
    if (iVar3 == 0) {
      pvVar6 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)local_38,
                              (FILE *)__s._M_p);
      if (pvVar6 == pvVar1) {
        uVar8 = (ulong)pvVar6 & 0xffffffff;
        goto LAB_0029dde9;
      }
    }
    piVar7 = __errno_location();
    iVar3 = *piVar7;
    *in_R9 = iVar3;
    *(bool *)(in_R9 + 1) = iVar3 != 0;
    *(generic_error_category **)(in_R9 + 2) =
         &boost::system::detail::cat_holder<void>::generic_category_instance;
  }
LAB_0029dde9:
  if ((FILE *)local_40._M_p != (FILE *)0x0) {
    fclose((FILE *)local_40._M_p);
  }
  return uVar8;
}

Assistant:

int posix_part_file::write(span<char const> buf, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);

		auto f = open_file(open_mode::read_write, ec);
		if (ec) return -1;

		auto const i = m_piece_map.find(piece);
		slot_index_t const slot = (i == m_piece_map.end())
			? allocate_slot(piece) : i->second;

		if (portable_fseeko(f.file(), slot_offset(slot) + offset, SEEK_SET) != 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		auto const written = std::fwrite(buf.data(), 1, std::size_t(buf.size()), f.file());
		if (written != std::size_t(buf.size()))
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		return int(written);
	}